

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
TOICompactRewardDecPOMDPDiscrete::~TOICompactRewardDecPOMDPDiscrete
          (TOICompactRewardDecPOMDPDiscrete *this,void **vtt)

{
  void *pvVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  pointer ppRVar5;
  bool bVar6;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
             super_MultiAgentDecisionProcess = pvVar1;
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 + *(long *)((long)pvVar1 + -0x50)) =
       vtt[0x11];
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                super_TransitionObservationIndependentMADPDiscrete.
                                super_MultiAgentDecisionProcess + -0x58)) = vtt[0x12];
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                super_TransitionObservationIndependentMADPDiscrete.
                                super_MultiAgentDecisionProcess + -0x60)) = vtt[0x13];
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                super_TransitionObservationIndependentMADPDiscrete.
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0x14];
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                super_TransitionObservationIndependentMADPDiscrete.
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[0x15];
  *(void **)&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
             field_0x280 = vtt[0x16];
  ppRVar5 = (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppRVar5) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      if (ppRVar5[uVar3] != (RewardModel *)0x0) {
        (*(ppRVar5[uVar3]->super_RewardModelDiscreteInterface).super_QTableInterface.
          _vptr_QTableInterface[3])();
      }
      ppRVar5 = (this->_m_p_rModels).
                super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar6 = (long)(this->_m_p_rModels).
                    super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppRVar5 >> 3 != uVar4;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar6);
  }
  if (ppRVar5 != (pointer)0x0) {
    operator_delete(ppRVar5,(long)(this->_m_p_rModels).
                                  super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar5)
    ;
  }
  puVar2 = (this->_m_nrTwoAgentActions).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->_m_nrTwoAgentActions).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pvVar1 = *(void **)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x2d0 - (long)pvVar1);
  }
  TOIDecPOMDPDiscrete::~TOIDecPOMDPDiscrete(&this->super_TOIDecPOMDPDiscrete,vtt + 1);
  return;
}

Assistant:

TOICompactRewardDecPOMDPDiscrete::~TOICompactRewardDecPOMDPDiscrete()
{
    for(unsigned int i=0;i!=_m_p_rModels.size();++i)
        delete(_m_p_rModels[i]);
}